

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

size_t calculate_rowstride(size_t width)

{
  size_t width_local;
  undefined8 local_8;
  
  if (width < 3) {
    local_8 = width * 8 + 0xf & 0xfffffffffffffff0;
  }
  else {
    local_8 = width * 8 + 0x1f & 0xffffffffffffffe0;
  }
  local_8 = local_8 >> 3;
  return local_8;
}

Assistant:

static inline size_t calculate_rowstride(size_t width) {
  // As soon as we hit the AVX bound, use 32 byte alignment. Otherwise use 16
  // byte alignment for SSE2 and 128 bit vectors.
  if (width > align_bound) {
    return ((width * sizeof(word) + 31) & ~31) / sizeof(word);
  } else {
    return ((width * sizeof(word) + 15) & ~15) / sizeof(word);
  }
}